

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

BIP155Network __thiscall CNetAddr::GetBIP155Network(CNetAddr *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  BIP155Network local_9;
  
  switch(*(undefined4 *)(in_RDI + 0x18)) {
  case 0:
  case 6:
  case 7:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x2a,"CNetAddr::BIP155Network CNetAddr::GetBIP155Network() const");
  case 1:
    local_9 = IPV4;
    break;
  case 2:
    local_9 = IPV6;
    break;
  case 3:
    local_9 = TORV3;
    break;
  case 4:
    local_9 = I2P;
    break;
  case 5:
    local_9 = CJDNS;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x2d,"CNetAddr::BIP155Network CNetAddr::GetBIP155Network() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

CNetAddr::BIP155Network CNetAddr::GetBIP155Network() const
{
    switch (m_net) {
    case NET_IPV4:
        return BIP155Network::IPV4;
    case NET_IPV6:
        return BIP155Network::IPV6;
    case NET_ONION:
        return BIP155Network::TORV3;
    case NET_I2P:
        return BIP155Network::I2P;
    case NET_CJDNS:
        return BIP155Network::CJDNS;
    case NET_INTERNAL:   // should have been handled before calling this function
    case NET_UNROUTABLE: // m_net is never and should not be set to NET_UNROUTABLE
    case NET_MAX:        // m_net is never and should not be set to NET_MAX
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}